

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

int field_is_flat(FMFormat_conflict f,FMTypeDesc *t)

{
  FMFormat_conflict in_RSI;
  long in_RDI;
  uint local_4;
  
  switch((FMTypeDesc *)(ulong)*(uint *)&in_RSI->context) {
  case (FMTypeDesc *)0x0:
    local_4 = 0;
    break;
  case (FMTypeDesc *)0x1:
    local_4 = field_is_flat(in_RSI,(FMTypeDesc *)(ulong)*(uint *)&in_RSI->context);
    break;
  case (FMTypeDesc *)0x2:
    local_4 = 0;
    break;
  case (FMTypeDesc *)0x3:
    local_4 = (uint)((*(int *)(*(long *)(*(long *)(in_RDI + 0x88) +
                                        (long)*(int *)((long)&in_RSI->format_name + 4) * 8) + 0x48)
                      != 0 ^ 0xffU) & 1);
    break;
  case (FMTypeDesc *)0x4:
    local_4 = 1;
    break;
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

extern int
field_is_flat(FMFormat f, FMTypeDesc *t)
{
    switch (t->type) {
    case FMType_pointer:
	return FALSE;
    case FMType_array:
	return field_is_flat(f, t->next);
    case FMType_string:
	return FALSE;
    case FMType_subformat:
	return !f->field_subformats[t->field_index]->variant;
    case FMType_simple:
	return TRUE;
    default:
	assert(FALSE);
    }
    /* notreached */
    return FALSE;
}